

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sad_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_14174cb::SADx3Test_DISABLED_Speed_Test::~SADx3Test_DISABLED_Speed_Test
          (SADx3Test_DISABLED_Speed_Test *this)

{
  void *in_RDI;
  
  ~SADx3Test_DISABLED_Speed_Test((SADx3Test_DISABLED_Speed_Test *)0xc3a4a8);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST_P(SADx3Test, DISABLED_Speed) {
  FillRandom(source_data_, source_stride_);
  FillRandom(GetReference(0), reference_stride_);
  FillRandom(GetReference(1), reference_stride_);
  FillRandom(GetReference(2), reference_stride_);
  FillRandom(GetReference(3), reference_stride_);
  SpeedSAD();
}